

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qchar.cpp
# Opt level: O1

QChar * decompositionHelper(char32_t ucs4,qsizetype *length,Decomposition *tag,QChar *buffer)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = ucs4 + L'\xffff5400';
  if (uVar3 < 0x2ba4) {
    buffer->ucs = (ushort)(uVar3 / 0x24c) | 0x1100;
    buffer[1].ucs = (short)((ulong)(uVar3 % 0x24c) * 0x924924a >> 0x20) + L'ᅡ';
    uVar4 = (uVar3 / 0x1c) * 0x1c;
    buffer[2].ucs = ((short)uVar3 - (short)uVar4) + L'ᆧ';
    *length = 3 - (ulong)(uVar3 == uVar4);
    *tag = Canonical;
    return buffer;
  }
  if ((uint)ucs4 < 0x3400) {
    uVar4 = (uint)ucs4 >> 4;
    uVar3 = 0xf;
  }
  else {
    uVar2 = 0xffff;
    if (0x2ffff < (uint)ucs4) goto LAB_00326d97;
    uVar4 = ((uint)(ucs4 + L'\xffffcc00') >> 8) + 0x340;
    uVar3 = 0xff;
  }
  uVar2 = *(ushort *)
           (QUnicodeTables::uc_decomposition_trie +
           (ulong)(uint)((uVar3 & ucs4) +
                        (uint)*(ushort *)(QUnicodeTables::uc_decomposition_trie + (ulong)uVar4 * 2))
           * 2);
LAB_00326d97:
  if (uVar2 != 0xffff) {
    uVar1 = *(ushort *)(QUnicodeTables::uc_decomposition_map + (ulong)uVar2 * 2);
    *tag = (uint)(byte)uVar1;
    *length = (ulong)(uVar1 >> 8);
    return (QChar *)(QUnicodeTables::uc_decomposition_map + (ulong)uVar2 * 2 + 2);
  }
  *length = 0;
  *tag = NoDecomposition;
  return (QChar *)0x0;
}

Assistant:

static const QChar * QT_FASTCALL decompositionHelper(
    char32_t ucs4, qsizetype *length, QChar::Decomposition  *tag, QChar *buffer)
{
    if (ucs4 >= Hangul_SBase && ucs4 < Hangul_SBase + Hangul_SCount) {
        // compute Hangul syllable decomposition as per UAX #15
        const char32_t SIndex = ucs4 - Hangul_SBase;
        buffer[0] = QChar(Hangul_LBase + SIndex / Hangul_NCount); // L
        buffer[1] = QChar(Hangul_VBase + (SIndex % Hangul_NCount) / Hangul_TCount); // V
        buffer[2] = QChar(Hangul_TBase + SIndex % Hangul_TCount); // T
        *length = buffer[2].unicode() == Hangul_TBase ? 2 : 3;
        *tag = QChar::Canonical;
        return buffer;
    }

    const unsigned short index = GET_DECOMPOSITION_INDEX(ucs4);
    if (index == 0xffff) {
        *length = 0;
        *tag = QChar::NoDecomposition;
        return nullptr;
    }

    const unsigned short *decomposition = uc_decomposition_map+index;
    *tag = QChar::Decomposition((*decomposition) & 0xff);
    *length = (*decomposition) >> 8;
    return reinterpret_cast<const QChar *>(decomposition + 1);
}